

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::SQVM(SQVM *this,SQSharedState *ss)

{
  SQSharedState *in_RSI;
  SQCollectable_conflict *in_RDI;
  SQCollectable *in_stack_ffffffffffffffa0;
  SQCollectable_conflict **this_00;
  
  SQCollectable::SQCollectable(in_stack_ffffffffffffffa0);
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQVM_00158c60;
  sqvector<SQObjectPtr>::sqvector((sqvector<SQObjectPtr> *)(in_RDI + 1));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 2));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&in_RDI[2].super_SQRefCounted._weakref);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&in_RDI[2]._prev);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&in_RDI[3].super_SQRefCounted._weakref);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&in_RDI[3]._prev);
  this_00 = &in_RDI[4]._next;
  sqvector<SQVM::CallInfo>::sqvector((sqvector<SQVM::CallInfo> *)this_00);
  sqvector<SQExceptionTrap>::sqvector((sqvector<SQExceptionTrap> *)(in_RDI + 5));
  in_RDI[5]._sharedstate = in_RSI;
  in_RDI[6]._next = (SQCollectable_conflict *)0x0;
  in_RDI[6]._sharedstate = (SQSharedState *)0xffffffffffffffff;
  in_RDI[6]._prev = (SQCollectable_conflict *)0x0;
  in_RDI[7].super_SQRefCounted._vptr_SQRefCounted = (_func_int **)0xffffffffffffffff;
  in_RDI[5]._prev = (SQCollectable_conflict *)0x0;
  in_RDI[6].super_SQRefCounted._vptr_SQRefCounted = (_func_int **)0x0;
  in_RDI[6].super_SQRefCounted._uiRef = 0;
  ::SQObjectPtr::Null((SQObjectPtr *)this_00);
  ::SQObjectPtr::Null((SQObjectPtr *)this_00);
  *(undefined1 *)&in_RDI[3].super_SQRefCounted._vptr_SQRefCounted = 0;
  in_RDI[3].super_SQRefCounted._uiRef = 0;
  ::SQObjectPtr::Null((SQObjectPtr *)this_00);
  in_RDI[1]._sharedstate = (SQSharedState *)0x0;
  in_RDI[5]._next = (SQCollectable_conflict *)0x0;
  in_RDI[6].super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  in_RDI->_next = (SQCollectable_conflict *)0x0;
  in_RDI->_prev = (SQCollectable_conflict *)0x0;
  in_RDI[5]._sharedstate = in_RSI;
  SQCollectable::AddToChain(&(in_RDI[5]._sharedstate)->_gc_chain,in_RDI);
  return;
}

Assistant:

SQVM::SQVM(SQSharedState *ss)
{
    _sharedstate=ss;
    _suspended = SQFalse;
    _suspended_target = -1;
    _suspended_root = SQFalse;
    _suspended_traps = -1;
    _foreignptr = NULL;
    _nnativecalls = 0;
    _nmetamethodscall = 0;
    _lasterror.Null();
    _errorhandler.Null();
    _debughook = false;
    _debughook_native = NULL;
    _debughook_closure.Null();
    _openouters = NULL;
    ci = NULL;
    _releasehook = NULL;
    INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);
}